

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loslib.c
# Opt level: O2

int getfield(lua_State *L,char *key,int d,int delta)

{
  int iVar1;
  undefined8 in_RAX;
  lua_Integer lVar2;
  char *fmt;
  int isnum;
  
  isnum = (int)((ulong)in_RAX >> 0x20);
  iVar1 = lua_getfield(L,-1,key);
  lVar2 = lua_tointegerx(L,-1,&isnum);
  if (isnum == 0) {
    if (iVar1 == 0) {
      if (-1 < d) goto LAB_00119118;
      fmt = "field \'%s\' missing in date table";
    }
    else {
      fmt = "field \'%s\' is not an integer";
    }
  }
  else {
    if (lVar2 + 0x3fffffffU < 0x7fffffff) {
      d = (int)lVar2 - delta;
LAB_00119118:
      lua_settop(L,-2);
      return d;
    }
    fmt = "field \'%s\' is out-of-bound";
  }
  iVar1 = luaL_error(L,fmt,key);
  return iVar1;
}

Assistant:

static int getfield (lua_State *L, const char *key, int d, int delta) {
  int isnum;
  int t = lua_getfield(L, -1, key);  /* get field and its type */
  lua_Integer res = lua_tointegerx(L, -1, &isnum);
  if (!isnum) {  /* field is not an integer? */
    if (t != LUA_TNIL)  /* some other value? */
      return luaL_error(L, "field '%s' is not an integer", key);
    else if (d < 0)  /* absent field; no default? */
      return luaL_error(L, "field '%s' missing in date table", key);
    res = d;
  }
  else {
    if (!(-L_MAXDATEFIELD <= res && res <= L_MAXDATEFIELD))
      return luaL_error(L, "field '%s' is out-of-bound", key);
    res -= delta;
  }
  lua_pop(L, 1);
  return (int)res;
}